

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

MessageType __thiscall cmMessenger::ConvertMessageType(cmMessenger *this,MessageType t)

{
  bool bVar1;
  MessageType local_14;
  bool warningsAsErrors;
  MessageType t_local;
  cmMessenger *this_local;
  
  local_14 = t;
  if ((t == AUTHOR_WARNING) || (t == AUTHOR_ERROR)) {
    bVar1 = GetDevWarningsAsErrors(this);
    if ((bVar1) && (t == AUTHOR_WARNING)) {
      local_14 = AUTHOR_ERROR;
    }
    else if ((!bVar1) && (t == AUTHOR_ERROR)) {
      local_14 = AUTHOR_WARNING;
    }
  }
  else if ((t == DEPRECATION_WARNING) || (t == DEPRECATION_ERROR)) {
    bVar1 = GetDeprecatedWarningsAsErrors(this);
    if ((bVar1) && (t == DEPRECATION_WARNING)) {
      local_14 = DEPRECATION_ERROR;
    }
    else if ((!bVar1) && (t == DEPRECATION_ERROR)) {
      local_14 = DEPRECATION_WARNING;
    }
  }
  return local_14;
}

Assistant:

cmake::MessageType cmMessenger::ConvertMessageType(cmake::MessageType t) const
{
  bool warningsAsErrors;

  if (t == cmake::AUTHOR_WARNING || t == cmake::AUTHOR_ERROR) {
    warningsAsErrors = this->GetDevWarningsAsErrors();
    if (warningsAsErrors && t == cmake::AUTHOR_WARNING) {
      t = cmake::AUTHOR_ERROR;
    } else if (!warningsAsErrors && t == cmake::AUTHOR_ERROR) {
      t = cmake::AUTHOR_WARNING;
    }
  } else if (t == cmake::DEPRECATION_WARNING ||
             t == cmake::DEPRECATION_ERROR) {
    warningsAsErrors = this->GetDeprecatedWarningsAsErrors();
    if (warningsAsErrors && t == cmake::DEPRECATION_WARNING) {
      t = cmake::DEPRECATION_ERROR;
    } else if (!warningsAsErrors && t == cmake::DEPRECATION_ERROR) {
      t = cmake::DEPRECATION_WARNING;
    }
  }

  return t;
}